

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

QString * QFileDialog::getExistingDirectory
                    (QString *__return_storage_ptr__,QWidget *parent,QString *caption,QString *dir,
                    Options options)

{
  char cVar1;
  long in_FS_OFFSET;
  QUrl selectedUrl;
  QUrl local_78;
  undefined1 local_70 [16];
  qsizetype local_60;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_70._0_8_ = (QArrayData *)0x0;
  local_70._8_8_ = L"file";
  local_60 = 4;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)&local_58,0,(QString *)local_70);
  QList<QString>::end((QList<QString> *)&local_58);
  if ((QArrayData *)local_70._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_70._0_8_ = *(int *)local_70._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_70._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_70._0_8_,2,0x10);
    }
  }
  local_70._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QUrl::fromLocalFile((QString *)&local_78);
  getExistingDirectoryUrl
            ((QFileDialog *)local_70,parent,caption,&local_78,options,(QStringList *)&local_58);
  QUrl::~QUrl(&local_78);
  cVar1 = QUrl::isLocalFile();
  if (cVar1 == '\0') {
    cVar1 = QUrl::isEmpty();
    if (cVar1 == '\0') {
      QUrl::toString(__return_storage_ptr__,local_70,0);
      goto LAB_004e6b3a;
    }
  }
  QUrl::toLocalFile();
LAB_004e6b3a:
  QUrl::~QUrl((QUrl *)local_70);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileDialog::getExistingDirectory(QWidget *parent,
                                          const QString &caption,
                                          const QString &dir,
                                          Options options)
{
    const QStringList schemes = QStringList(QStringLiteral("file"));
    const QUrl selectedUrl =
            getExistingDirectoryUrl(parent, caption, QUrl::fromLocalFile(dir), options, schemes);
    if (selectedUrl.isLocalFile() || selectedUrl.isEmpty())
        return selectedUrl.toLocalFile();
    else
        return selectedUrl.toString();
}